

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O1

int XmlParseXmlDecl(int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                   char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                   int *standalone)

{
  char *pcVar1;
  int iVar2;
  ENCODING *pEVar3;
  ulong uVar4;
  int i;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  bool bVar9;
  char *name;
  char *val;
  char *p;
  char buf_1 [128];
  char *local_f8;
  undefined8 local_f0;
  char **local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8 [15];
  char local_39 [9];
  
  local_e8 = (char **)CONCAT44(local_e8._4_4_,isGeneralTextEntity);
  local_c8 = (char *)0x0;
  local_e0 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_f8 = ptr + (long)enc->minBytesPerChar * 5;
  local_d8 = end + (long)enc->minBytesPerChar * -2;
  iVar2 = parsePseudoAttribute(enc,local_f8,local_d8,&local_e0,&local_d0,&local_c8,&local_f8);
  pcVar6 = local_e0;
  pcVar7 = local_f8;
  if (iVar2 == 0 || local_e0 == (char *)0x0) goto LAB_003e5c3d;
  iVar2 = (*enc->nameMatchesAscii)(enc,local_e0,local_d0,"version");
  if (iVar2 == 0) {
    pcVar7 = pcVar6;
    if ((int)local_e8 == 0) goto LAB_003e5c3d;
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = local_c8;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = local_f8;
    }
    iVar2 = parsePseudoAttribute(enc,local_f8,local_d8,&local_e0,&local_d0,&local_c8,&local_f8);
    pcVar7 = local_f8;
    if (iVar2 == 0) goto LAB_003e5c3d;
    if (local_e0 == (char *)0x0) {
      if ((int)local_e8 == 0) {
        return 1;
      }
      goto LAB_003e5c3d;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,local_e0,local_d0,"encoding");
  pcVar6 = local_c8;
  if (iVar2 != 0) {
    local_b8[0] = local_c8;
    local_c0 = (char *)&local_f0;
    (*enc->utf8Convert)(enc,local_b8,local_d8,&local_c0,(char *)((long)&local_f0 + 1));
    if ((local_c0 == (char *)&local_f0) || (0x19 < ((int)(char)local_f0 & 0xffffffdfU) - 0x41)) {
      *badPtr = pcVar6;
LAB_003e5d77:
      bVar9 = false;
      iVar2 = 0;
    }
    else {
      if (encodingName != (char **)0x0) {
        *encodingName = pcVar6;
      }
      if (encoding != (ENCODING **)0x0) {
        pcVar7 = local_f8 + -(long)enc->minBytesPerChar;
        local_c0 = pcVar6;
        local_f0 = local_b8;
        (*enc->utf8Convert)(enc,&local_c0,pcVar7,(char **)&local_f0,local_39);
        if (local_c0 == pcVar7) {
          *(undefined1 *)local_f0 = 0;
          iVar2 = streqci((char *)local_b8,"UTF-16");
          if ((iVar2 == 0) || (pEVar3 = enc, enc->minBytesPerChar != 2)) {
            ppcVar8 = getEncodingIndex::encodingNames;
            lVar5 = 0;
            do {
              iVar2 = streqci((char *)local_b8,*ppcVar8);
              if (iVar2 != 0) goto LAB_003e5f19;
              lVar5 = lVar5 + 1;
              ppcVar8 = ppcVar8 + 1;
            } while (lVar5 != 6);
            lVar5 = 0xffffffff;
LAB_003e5f19:
            if ((int)lVar5 == -1) goto LAB_003e5d2a;
            pEVar3 = encodings[(int)lVar5];
          }
        }
        else {
LAB_003e5d2a:
          pEVar3 = (ENCODING *)0x0;
        }
        *encoding = pEVar3;
      }
      iVar2 = parsePseudoAttribute(enc,local_f8,local_d8,&local_e0,&local_d0,&local_c8,&local_f8);
      if (iVar2 == 0) {
        *badPtr = local_f8;
        goto LAB_003e5d77;
      }
      bVar9 = local_e0 != (char *)0x0;
      iVar2 = 1;
    }
    if (!bVar9) {
      return iVar2;
    }
  }
  pcVar7 = local_e0;
  iVar2 = (*enc->nameMatchesAscii)(enc,local_e0,local_d0,"standalone");
  pcVar1 = local_c8;
  pcVar6 = local_f8;
  if (((int)local_e8 == 0) && (iVar2 != 0)) {
    iVar2 = (*enc->nameMatchesAscii)(enc,local_c8,local_f8 + -(long)enc->minBytesPerChar,"yes");
    if (iVar2 == 0) {
      iVar2 = (*enc->nameMatchesAscii)(enc,pcVar1,pcVar6 + -(long)enc->minBytesPerChar,"no");
      pcVar7 = pcVar1;
      if (iVar2 == 0) goto LAB_003e5c3d;
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
    if (standalone != (int *)0x0) {
      *standalone = iVar2;
    }
    local_e8 = badPtr;
    while( true ) {
      local_c0 = (char *)&local_f0;
      local_b8[0] = pcVar6;
      (*enc->utf8Convert)(enc,local_b8,local_d8,&local_c0,(char *)((long)&local_f0 + 1));
      uVar4 = (ulong)(uint)(int)(char)local_f0;
      if (local_c0 == (char *)&local_f0) {
        uVar4 = 0xffffffff;
      }
      if ((0x20 < (uint)uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
      pcVar6 = pcVar6 + enc->minBytesPerChar;
    }
    pcVar7 = pcVar6;
    badPtr = local_e8;
    if (pcVar6 == local_d8) {
      return 1;
    }
  }
LAB_003e5c3d:
  *badPtr = pcVar7;
  return 0;
}

Assistant:

int
NS(XmlParseXmlDecl)(int isGeneralTextEntity,
                    const ENCODING *enc,
                    const char *ptr,
                    const char *end,
                    const char **badPtr,
                    const char **versionPtr,
                    const char **versionEndPtr,
                    const char **encodingName,
                    const ENCODING **encoding,
                    int *standalone)
{
  return doParseXmlDecl(NS(findEncoding),
                        isGeneralTextEntity,
                        enc,
                        ptr,
                        end,
                        badPtr,
                        versionPtr,
                        versionEndPtr,
                        encodingName,
                        encoding,
                        standalone);
}